

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O0

int Lpk_MapTreeBestCofVar(Lpk_Man_t *p,uint *pTruth,int nVars,uint *pCof0,uint *pCof1)

{
  int iVar1;
  int iVar2;
  int local_48;
  int nSuppSizeMin;
  int nSuppSizeCur;
  int nSuppSizeCur1;
  int nSuppSizeCur0;
  int iBestVar;
  int i;
  uint *pCof1_local;
  uint *pCof0_local;
  int nVars_local;
  uint *pTruth_local;
  Lpk_Man_t *p_local;
  
  nSuppSizeCur1 = -1;
  local_48 = 100000000;
  for (nSuppSizeCur0 = 0; nSuppSizeCur0 < nVars; nSuppSizeCur0 = nSuppSizeCur0 + 1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,nSuppSizeCur0);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,nSuppSizeCur0);
    iVar1 = Kit_TruthSupportSize(pCof0,nVars);
    iVar2 = Kit_TruthSupportSize(pCof1,nVars);
    if (((iVar1 <= p->pPars->nLutSize) && (iVar2 <= p->pPars->nLutSize)) &&
       (iVar1 + iVar2 < local_48)) {
      nSuppSizeCur1 = nSuppSizeCur0;
      local_48 = iVar1 + iVar2;
    }
  }
  if (nSuppSizeCur1 != -1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,nSuppSizeCur1);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,nSuppSizeCur1);
  }
  return nSuppSizeCur1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the best cofactoring variable.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Lpk_MapTreeBestCofVar( Lpk_Man_t * p, unsigned * pTruth, int nVars, unsigned * pCof0, unsigned * pCof1 )
{
    int i, iBestVar, nSuppSizeCur0, nSuppSizeCur1, nSuppSizeCur, nSuppSizeMin;
    // iterate through variables
    iBestVar = -1;
    nSuppSizeMin = KIT_INFINITY;
    for ( i = 0; i < nVars; i++ )
    {
        // cofactor the functiona and get support sizes
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        nSuppSizeCur0 = Kit_TruthSupportSize( pCof0, nVars );
        nSuppSizeCur1 = Kit_TruthSupportSize( pCof1, nVars );
        nSuppSizeCur  = nSuppSizeCur0 + nSuppSizeCur1;
        // skip cofactoring that goes above the limit
        if ( nSuppSizeCur0 > p->pPars->nLutSize || nSuppSizeCur1 > p->pPars->nLutSize )
            continue;
        // compare this variable with other variables
        if ( nSuppSizeMin > nSuppSizeCur ) 
        {
            nSuppSizeMin = nSuppSizeCur;
            iBestVar = i;
        }
    }
    // cofactor w.r.t. this variable
    if ( iBestVar != -1 )
    {
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, iBestVar );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, iBestVar );
    }
    return iBestVar;
}